

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_function_pool.cpp
# Opt level: O2

void multithreaded(vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                   *frame)

{
  pointer pIVar1;
  uint8_t threshold;
  ThreadPool *pTVar2;
  long lVar3;
  ulong uVar4;
  Image map;
  Image result;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pTVar2 = ThreadPoolMonoid::instance();
  ThreadPool::resize(pTVar2,4);
  pIVar1 = (frame->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&map,pIVar1->_width,pIVar1->_height,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&map,'\0');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&result,map._width,map._height,'\x01','\x01');
  uVar4 = 1;
  lVar3 = 0;
  while( true ) {
    pIVar1 = (frame->
             super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(frame->
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x28) <= uVar4)
    break;
    Function_Pool::Subtract
              ((Image *)((long)&pIVar1[1]._vptr_ImageTemplate + lVar3),
               (Image *)((long)&pIVar1->_vptr_ImageTemplate + lVar3),&result);
    Function_Pool::Histogram
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&result);
    threshold = Image_Function::GetThreshold
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    if (threshold != '\0') {
      Function_Pool::Threshold(&result,&result,threshold);
      Function_Pool::BitwiseOr(&map,&result,&map);
    }
    lVar3 = lVar3 + 0x28;
    uVar4 = uVar4 + 1;
  }
  pTVar2 = ThreadPoolMonoid::instance();
  ThreadPool::stop(pTVar2);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&result);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&map);
  return;
}

Assistant:

void multithreaded( const std::vector < PenguinV_Image::Image > & frame )
{
    // okay we setup 4 thread in global thread pool
    ThreadPoolMonoid::instance().resize( 4 );

    // Prepare image map
    PenguinV_Image::Image map( frame.front().width(), frame.front().height() );
    map.fill( 0 );

    PenguinV_Image::Image result( map.width(), map.height() );

    // As you see the only difference in this loop is namespace name
    for( size_t i = 0; i + 1 < frame.size(); ++i ) {
        // subtract one image from another
        Function_Pool::Subtract( frame[i + 1], frame[i], result );

        // find optimal threshold
        uint8_t threshold = Image_Function::GetThreshold( Function_Pool::Histogram( result ) );

        if( threshold > 0 ) { // there is something more than just background!
            // threshold image
            Function_Pool::Threshold( result, result, threshold );
            // add result to the map
            Function_Pool::BitwiseOr( map, result, map );
        }
    }

    // here we have to save the image map but don't do this in the example

    // We stop all threads in thread pool
    ThreadPoolMonoid::instance().stop();
}